

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Performance::anon_unknown_1::OperatorPerformanceCase::iterate
          (OperatorPerformanceCase *this)

{
  TestContext *this_00;
  State SVar1;
  int iVar2;
  deUint64 dVar3;
  TestLog *pTVar4;
  InitialCalibration *pIVar5;
  reference pvVar6;
  size_type sVar7;
  reference pvVar8;
  reference __x;
  iterator __first;
  TestLog *pTVar9;
  SampleBuilder *pSVar10;
  reference pvVar11;
  MessageBuilder *pMVar12;
  InternalError *pIVar13;
  reference pfVar14;
  reference pvVar15;
  char *pcVar16;
  int precision;
  LineParameters *params;
  LineParameters *params_00;
  LineParameters *params_01;
  float fVar17;
  float fVar18;
  float extraout_XMM0_Da;
  int local_1b20;
  float local_194c;
  vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
  *local_1948;
  string local_1928;
  allocator<char> local_1901;
  string local_1900;
  allocator<char> local_18d9;
  string local_18d8;
  allocator<char> local_18b1;
  string local_18b0;
  LogNumber<long> local_1890;
  allocator<char> local_1819;
  string local_1818;
  allocator<char> local_17f1;
  string local_17f0;
  allocator<char> local_17c9;
  string local_17c8;
  LogNumber<float> local_17a8;
  MessageBuilder local_1740;
  MessageBuilder local_15c0;
  allocator<char> local_1439;
  string local_1438;
  allocator<char> local_1411;
  string local_1410;
  allocator<char> local_13e9;
  string local_13e8;
  LogNumber<float> local_13c8;
  allocator<char> local_1359;
  string local_1358;
  allocator<char> local_1331;
  string local_1330;
  allocator<char> local_1309;
  string local_1308;
  LogNumber<float> local_12e8;
  allocator<char> local_1279;
  string local_1278;
  allocator<char> local_1251;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1210;
  allocator<char> local_11e9;
  string local_11e8;
  LogNumber<float> local_11c8;
  allocator<char> local_1159;
  string local_1158;
  allocator<char> local_1131;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10f0;
  allocator<char> local_10c9;
  string local_10c8;
  LogNumber<long> local_10a8;
  allocator<char> local_1031;
  string local_1030;
  allocator<char> local_1009;
  string local_1008;
  allocator<char> local_fe1;
  string local_fe0;
  LogNumber<long> local_fc0;
  allocator<char> local_f49;
  string local_f48;
  allocator<char> local_f21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ee0;
  allocator<char> local_eb9;
  string local_eb8;
  LogNumber<long> local_e98;
  LineParameters local_e24;
  int local_e1c;
  double dStack_e18;
  int numFreeOps;
  double megaOpsPerSecond;
  double usecsPerSingleOp;
  double usecsPerDrawCallPerOp;
  int vertexOrFragmentCount;
  float usecsPerFramePerOp;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_df0;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_de8;
  float local_de0;
  int local_ddc;
  float maxSlope;
  int i_2;
  vector<float,_std::allocator<float>_> perProgramSlopes;
  int local_c3c;
  undefined1 local_c38 [4];
  int progNdx_2;
  MessageBuilder local_c18;
  string local_a98;
  string local_a78;
  MessageBuilder local_a58;
  MessageBuilder local_8d8;
  allocator<char> local_751;
  string local_750;
  allocator<char> local_729;
  string local_728;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  LogNumber<float> local_6c8;
  SampleBuilder local_660;
  int local_640;
  allocator<char> local_639;
  int i_1;
  allocator<char> local_611;
  string local_610;
  allocator<char> local_5e9;
  string local_5e8;
  LogValueInfo local_5c8;
  allocator<char> local_559;
  string local_558;
  allocator<char> local_531;
  string local_530;
  allocator<char> local_509;
  string local_508;
  LogValueInfo local_4e8;
  allocator<char> local_479;
  string local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  LogSampleList local_418;
  SampleBuilder local_3d8;
  int local_3b4;
  int local_3b0;
  int j;
  int i;
  allocator<char> local_381;
  string local_380;
  allocator<char> local_359;
  string local_358;
  LogValueInfo local_338;
  allocator<char> local_2c9;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  LogValueInfo local_258;
  allocator<char> local_1e9;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  LogSampleList local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  ScopedLogSection local_e8;
  ScopedLogSection section;
  undefined1 local_d0 [8];
  vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
  records_1;
  string progNdxStr;
  SegmentedEstimator *estimator;
  int progNdx_1;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_80;
  SegmentedEstimator local_68;
  int local_54;
  undefined1 local_50 [4];
  int progNdx;
  vector<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
  estimators;
  int drawCallCount;
  TestLog *log;
  vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
  *records;
  State calibratorState;
  OperatorPerformanceCase *this_local;
  
  SVar1 = deqp::gls::TheilSenCalibrator::getState(&this->m_calibrator);
  if (SVar1 == STATE_FINISHED) {
    if ((this->m_state != STATE_FIND_HIGH_WORKLOAD) && (this->m_state != STATE_MEASURING)) {
      pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
      estimators.
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           deqp::gls::TheilSenCalibrator::getCallCount(&this->m_calibrator);
      std::
      vector<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
      ::vector((vector<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
                *)local_50);
      for (local_54 = 0; iVar2 = local_54,
          sVar7 = std::
                  vector<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                  ::size(&this->m_programs), iVar2 < (int)sVar7; local_54 = local_54 + 1) {
        getWorkloadMedianDataPoints(&local_80,this,local_54);
        computeSegmentedEstimator(&local_68,&local_80);
        std::
        vector<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
        ::push_back((vector<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
                     *)local_50,&local_68);
        std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~vector
                  (&local_80);
      }
      for (estimator._0_4_ = 0; iVar2 = (int)estimator,
          sVar7 = std::
                  vector<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                  ::size(&this->m_programs), iVar2 < (int)sVar7;
          estimator._0_4_ = (int)estimator + 1) {
        pvVar8 = std::
                 vector<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
                 ::operator[]((vector<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
                               *)local_50,(long)(int)estimator);
        de::toString<int>((string *)
                          &records_1.
                           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(int *)&estimator);
        __x = std::
              vector<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
              ::operator[](&this->m_workloadRecords,(long)(int)estimator);
        std::
        vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
        ::vector((vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                  *)local_d0,__x);
        __first = std::
                  vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                  ::begin((vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                           *)local_d0);
        section.m_log =
             (TestLog *)
             std::
             vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
             ::end((vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                    *)local_d0);
        std::
        sort<__gnu_cxx::__normal_iterator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord*,std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>>>>
                  ((__normal_iterator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord_*,_std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>
                    )__first._M_current,
                   (__normal_iterator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord_*,_std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>
                    )section.m_log);
        std::operator+(&local_128,"Program",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &records_1.
                        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::operator+(&local_108,&local_128,"Measurements");
        std::operator+(&local_148,"Measurements for program ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &records_1.
                        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        tcu::ScopedLogSection::ScopedLogSection(&local_e8,pTVar4,&local_108,&local_148);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_128);
        std::operator+(&local_1c8,"Program",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &records_1.
                        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::operator+(&local_1a8,&local_1c8,"IndividualFrameTimes");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1e8,"Individual frame times",&local_1e9);
        tcu::LogSampleList::LogSampleList(&local_188,&local_1a8,&local_1e8);
        pTVar9 = tcu::TestLog::operator<<(pTVar4,&local_188);
        pTVar9 = tcu::TestLog::operator<<(pTVar9,(SampleInfoToken *)&tcu::TestLog::SampleInfo);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_278,"Workload",&local_279);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a0,"Workload",&local_2a1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"",&local_2c9);
        tcu::LogValueInfo::LogValueInfo
                  (&local_258,&local_278,&local_2a0,&local_2c8,QP_SAMPLE_VALUE_TAG_PREDICTOR);
        pTVar9 = tcu::TestLog::operator<<(pTVar9,&local_258);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_358,"FrameTime",&local_359);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_380,"Frame time",&local_381);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&i,"us",(allocator<char> *)((long)&j + 3));
        tcu::LogValueInfo::LogValueInfo
                  (&local_338,&local_358,&local_380,(string *)&i,QP_SAMPLE_VALUE_TAG_RESPONSE);
        pTVar9 = tcu::TestLog::operator<<(pTVar9,&local_338);
        tcu::TestLog::operator<<(pTVar9,(EndSampleInfoToken *)&tcu::TestLog::EndSampleInfo);
        tcu::LogValueInfo::~LogValueInfo(&local_338);
        std::__cxx11::string::~string((string *)&i);
        std::allocator<char>::~allocator((allocator<char> *)((long)&j + 3));
        std::__cxx11::string::~string((string *)&local_380);
        std::allocator<char>::~allocator(&local_381);
        std::__cxx11::string::~string((string *)&local_358);
        std::allocator<char>::~allocator(&local_359);
        tcu::LogValueInfo::~LogValueInfo(&local_258);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::allocator<char>::~allocator(&local_2c9);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::allocator<char>::~allocator(&local_2a1);
        std::__cxx11::string::~string((string *)&local_278);
        std::allocator<char>::~allocator(&local_279);
        tcu::LogSampleList::~LogSampleList(&local_188);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::allocator<char>::~allocator(&local_1e9);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_1c8);
        for (local_3b0 = 0; iVar2 = local_3b0,
            sVar7 = std::
                    vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                    ::size((vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                            *)local_d0), iVar2 < (int)sVar7; local_3b0 = local_3b0 + 1) {
          local_3b4 = 0;
          while( true ) {
            iVar2 = local_3b4;
            pvVar6 = std::
                     vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                     ::operator[]((vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                                   *)local_d0,(long)local_3b0);
            sVar7 = std::vector<float,_std::allocator<float>_>::size(&pvVar6->frameTimes);
            if ((int)sVar7 <= iVar2) break;
            tcu::TestLog::operator<<(&local_3d8,pTVar4,(BeginSampleToken *)&tcu::TestLog::Sample);
            pvVar6 = std::
                     vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                     ::operator[]((vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                                   *)local_d0,(long)local_3b0);
            pSVar10 = tcu::SampleBuilder::operator<<(&local_3d8,pvVar6->workloadSize);
            pvVar6 = std::
                     vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                     ::operator[]((vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                                   *)local_d0,(long)local_3b0);
            pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                                (&pvVar6->frameTimes,(long)local_3b4);
            pSVar10 = tcu::SampleBuilder::operator<<(pSVar10,*pvVar11);
            tcu::SampleBuilder::operator<<(pSVar10,(EndSampleToken *)&tcu::TestLog::EndSample);
            tcu::SampleBuilder::~SampleBuilder(&local_3d8);
            local_3b4 = local_3b4 + 1;
          }
        }
        tcu::TestLog::operator<<(pTVar4,(EndSampleListToken *)&tcu::TestLog::EndSampleList);
        std::operator+(&local_458,"Program",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &records_1.
                        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::operator+(&local_438,&local_458,"MedianFrameTimes");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_478,"Median frame times",&local_479);
        tcu::LogSampleList::LogSampleList(&local_418,&local_438,&local_478);
        pTVar9 = tcu::TestLog::operator<<(pTVar4,&local_418);
        pTVar9 = tcu::TestLog::operator<<(pTVar9,(SampleInfoToken *)&tcu::TestLog::SampleInfo);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_508,"Workload",&local_509);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_530,"Workload",&local_531);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_558,"",&local_559);
        tcu::LogValueInfo::LogValueInfo
                  (&local_4e8,&local_508,&local_530,&local_558,QP_SAMPLE_VALUE_TAG_PREDICTOR);
        pTVar9 = tcu::TestLog::operator<<(pTVar9,&local_4e8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5e8,"MedianFrameTime",&local_5e9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_610,"Median frame time",&local_611);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&i_1,"us",&local_639);
        tcu::LogValueInfo::LogValueInfo
                  (&local_5c8,&local_5e8,&local_610,(string *)&i_1,QP_SAMPLE_VALUE_TAG_RESPONSE);
        pTVar9 = tcu::TestLog::operator<<(pTVar9,&local_5c8);
        tcu::TestLog::operator<<(pTVar9,(EndSampleInfoToken *)&tcu::TestLog::EndSampleInfo);
        tcu::LogValueInfo::~LogValueInfo(&local_5c8);
        std::__cxx11::string::~string((string *)&i_1);
        std::allocator<char>::~allocator(&local_639);
        std::__cxx11::string::~string((string *)&local_610);
        std::allocator<char>::~allocator(&local_611);
        std::__cxx11::string::~string((string *)&local_5e8);
        std::allocator<char>::~allocator(&local_5e9);
        tcu::LogValueInfo::~LogValueInfo(&local_4e8);
        std::__cxx11::string::~string((string *)&local_558);
        std::allocator<char>::~allocator(&local_559);
        std::__cxx11::string::~string((string *)&local_530);
        std::allocator<char>::~allocator(&local_531);
        std::__cxx11::string::~string((string *)&local_508);
        std::allocator<char>::~allocator(&local_509);
        tcu::LogSampleList::~LogSampleList(&local_418);
        std::__cxx11::string::~string((string *)&local_478);
        std::allocator<char>::~allocator(&local_479);
        std::__cxx11::string::~string((string *)&local_438);
        std::__cxx11::string::~string((string *)&local_458);
        for (local_640 = 0; iVar2 = local_640,
            sVar7 = std::
                    vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                    ::size((vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                            *)local_d0), iVar2 < (int)sVar7; local_640 = local_640 + 1) {
          tcu::TestLog::operator<<(&local_660,pTVar4,(BeginSampleToken *)&tcu::TestLog::Sample);
          pvVar6 = std::
                   vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                   ::operator[]((vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                                 *)local_d0,(long)local_640);
          pSVar10 = tcu::SampleBuilder::operator<<(&local_660,pvVar6->workloadSize);
          pvVar6 = std::
                   vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                   ::operator[]((vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                                 *)local_d0,(long)local_640);
          fVar17 = WorkloadRecord::getMedianTime(pvVar6);
          pSVar10 = tcu::SampleBuilder::operator<<(pSVar10,fVar17);
          tcu::SampleBuilder::operator<<(pSVar10,(EndSampleToken *)&tcu::TestLog::EndSample);
          tcu::SampleBuilder::~SampleBuilder(&local_660);
        }
        tcu::TestLog::operator<<(pTVar4,(EndSampleListToken *)&tcu::TestLog::EndSampleList);
        std::operator+(&local_708,"Program",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &records_1.
                        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::operator+(&local_6e8,&local_708,"WorkloadCostEstimate");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_728,"Workload cost estimate",&local_729);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_750,"us / workload",&local_751);
        tcu::LogNumber<float>::LogNumber
                  (&local_6c8,&local_6e8,&local_728,&local_750,QP_KEY_TAG_TIME,
                   (pvVar8->right).coefficient);
        tcu::TestLog::operator<<(pTVar4,&local_6c8);
        tcu::LogNumber<float>::~LogNumber(&local_6c8);
        std::__cxx11::string::~string((string *)&local_750);
        std::allocator<char>::~allocator(&local_751);
        std::__cxx11::string::~string((string *)&local_728);
        std::allocator<char>::~allocator(&local_729);
        std::__cxx11::string::~string((string *)&local_6e8);
        std::__cxx11::string::~string((string *)&local_708);
        fVar17 = pvVar8->pivotX;
        fVar18 = std::numeric_limits<float>::infinity();
        if (fVar17 <= -fVar18) {
          tcu::TestLog::operator<<(&local_c18,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar12 = tcu::MessageBuilder::operator<<
                              (&local_c18,
                               (char (*) [44])"Note: the data seem to form a single line: ");
          lineParamsString_abi_cxx11_((string *)local_c38,(Performance *)&pvVar8->right,params_01);
          pMVar12 = tcu::MessageBuilder::operator<<
                              (pMVar12,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_c38);
          tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)local_c38);
          tcu::MessageBuilder::~MessageBuilder(&local_c18);
        }
        else {
          tcu::TestLog::operator<<(&local_a58,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar12 = tcu::MessageBuilder::operator<<
                              (&local_a58,
                               (char (*) [66])
                               "Note: the data points with x coordinate greater than or equal to ");
          pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&pvVar8->pivotX);
          pMVar12 = tcu::MessageBuilder::operator<<
                              (pMVar12,(char (*) [93])
                                       " seem to form a rising line, and the rest of data points seem to form a near-horizontal line"
                              );
          pTVar9 = tcu::MessageBuilder::operator<<
                             (pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::TestLog::operator<<(&local_8d8,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar12 = tcu::MessageBuilder::operator<<
                              (&local_8d8,(char (*) [40])"Note: the left line is estimated to be ");
          lineParamsString_abi_cxx11_(&local_a78,(Performance *)&pvVar8->left,params);
          pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_a78);
          pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [21])" and the right line ");
          lineParamsString_abi_cxx11_(&local_a98,(Performance *)&pvVar8->right,params_00);
          pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_a98);
          tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&local_a98);
          std::__cxx11::string::~string((string *)&local_a78);
          tcu::MessageBuilder::~MessageBuilder(&local_8d8);
          tcu::MessageBuilder::~MessageBuilder(&local_a58);
        }
        tcu::ScopedLogSection::~ScopedLogSection(&local_e8);
        std::
        vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
        ::~vector((vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                   *)local_d0);
        std::__cxx11::string::~string
                  ((string *)
                   &records_1.
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      for (local_c3c = 0; iVar2 = local_c3c,
          sVar7 = std::
                  vector<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                  ::size(&this->m_programs), iVar2 < (int)sVar7; local_c3c = local_c3c + 1) {
        pvVar8 = std::
                 vector<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
                 ::operator[]((vector<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
                               *)local_50,(long)local_c3c);
        if ((pvVar8->right).coefficient <= 0.0) {
          tcu::TestLog::operator<<
                    ((MessageBuilder *)
                     &perProgramSlopes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,pTVar4,
                     (BeginMessageToken *)&tcu::TestLog::Message);
          pMVar12 = tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)
                               &perProgramSlopes.super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                               (char (*) [35])"Slope of measurements for program ");
          pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,&local_c3c);
          pMVar12 = tcu::MessageBuilder::operator<<
                              (pMVar12,(char (*) [44])
                                       " isn\'t positive. Can\'t get sensible result.");
          tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder
                    ((MessageBuilder *)
                     &perProgramSlopes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          pIVar13 = (InternalError *)__cxa_allocate_exception(0x38);
          tcu::InternalError::InternalError
                    (pIVar13,"Unable to get sensible measurements for estimation",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pShaderOperatorTests.cpp"
                     ,0x3ea);
          __cxa_throw(pIVar13,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
        }
      }
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&maxSlope);
      for (local_ddc = 0; iVar2 = local_ddc,
          sVar7 = std::
                  vector<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                  ::size(&this->m_programs), iVar2 < (int)sVar7; local_ddc = local_ddc + 1) {
        pvVar8 = std::
                 vector<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
                 ::operator[]((vector<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
                               *)local_50,(long)local_ddc);
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)&maxSlope,&(pvVar8->right).coefficient);
      }
      (*(this->super_TestCase).super_TestNode._vptr_TestNode[9])();
      local_df0._M_current =
           (float *)std::vector<float,_std::allocator<float>_>::begin
                              ((vector<float,_std::allocator<float>_> *)&maxSlope);
      _vertexOrFragmentCount =
           std::vector<float,_std::allocator<float>_>::end
                     ((vector<float,_std::allocator<float>_> *)&maxSlope);
      local_de8 = std::
                  max_element<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                            (local_df0,_vertexOrFragmentCount);
      pfVar14 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
                operator*(&local_de8);
      local_de0 = *pfVar14;
      (*(this->super_TestCase).super_TestNode._vptr_TestNode[8])(this,&maxSlope);
      usecsPerDrawCallPerOp._4_4_ = extraout_XMM0_Da;
      if (this->m_caseType == CASETYPE_VERTEX) {
        local_1b20 = getNumVertices(this->m_gridSizeX,this->m_gridSizeY);
      }
      else {
        local_1b20 = this->m_viewportWidth * this->m_viewportHeight;
      }
      usecsPerDrawCallPerOp._0_4_ = local_1b20;
      usecsPerSingleOp =
           (double)usecsPerDrawCallPerOp._4_4_ /
           (double)estimators.
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      megaOpsPerSecond = usecsPerSingleOp / (double)local_1b20;
      dStack_e18 = (double)(estimators.
                            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ * local_1b20) /
                   (double)usecsPerDrawCallPerOp._4_4_;
      pvVar8 = std::
               vector<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
               ::operator[]((vector<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
                             *)local_50,0);
      pvVar15 = std::
                vector<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
                ::operator[]((vector<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
                              *)local_50,0);
      deqp::gls::LineParameters::LineParameters
                (&local_e24,(pvVar15->right).offset,usecsPerDrawCallPerOp._4_4_);
      fVar17 = intersectionX(&pvVar8->left,&local_e24);
      fVar17 = ::deFloatFloor(fVar17);
      local_e1c = de::max<int>(0,(int)fVar17);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_eb8,"VertexOrFragmentCount",&local_eb9);
      pcVar16 = "Fragment";
      if (this->m_caseType == CASETYPE_VERTEX) {
        pcVar16 = "Vertex";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f20,pcVar16,&local_f21);
      std::operator+(&local_f00,"R = ",&local_f20);
      std::operator+(&local_ee0,&local_f00," count");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f48,"",&local_f49);
      tcu::LogNumber<long>::LogNumber
                (&local_e98,&local_eb8,&local_ee0,&local_f48,QP_KEY_TAG_NONE,
                 (long)usecsPerDrawCallPerOp._0_4_);
      pTVar9 = tcu::TestLog::operator<<(pTVar4,&local_e98);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_fe0,"DrawCallsPerFrame",&local_fe1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1008,"D = Draw calls per frame",&local_1009);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1030,"",&local_1031);
      tcu::LogNumber<long>::LogNumber
                (&local_fc0,&local_fe0,&local_1008,&local_1030,QP_KEY_TAG_NONE,
                 (long)estimators.
                       super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      pTVar9 = tcu::TestLog::operator<<(pTVar9,&local_fc0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_10c8,"VerticesOrFragmentsPerFrame",&local_10c9);
      pcVar16 = "Fragments";
      if (this->m_caseType == CASETYPE_VERTEX) {
        pcVar16 = "Vertices";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1130,pcVar16,&local_1131);
      std::operator+(&local_1110,"R*D = ",&local_1130);
      std::operator+(&local_10f0,&local_1110," per frame");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1158,"",&local_1159);
      tcu::LogNumber<long>::LogNumber
                (&local_10a8,&local_10c8,&local_10f0,&local_1158,QP_KEY_TAG_NONE,
                 (long)(usecsPerDrawCallPerOp._0_4_ *
                       estimators.
                       super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_));
      pTVar9 = tcu::TestLog::operator<<(pTVar9,&local_10a8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_11e8,"TimePerFramePerOp",&local_11e9);
      pcVar16 = "fragments";
      if (this->m_caseType == CASETYPE_VERTEX) {
        pcVar16 = "vertices";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1250,pcVar16,&local_1251);
      std::operator+(&local_1230,"Estimated cost of R*D ",&local_1250);
      std::operator+(&local_1210,&local_1230," (i.e. one frame) with one shader operation");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1278,"us",&local_1279);
      tcu::LogNumber<float>::LogNumber
                (&local_11c8,&local_11e8,&local_1210,&local_1278,QP_KEY_TAG_TIME,
                 usecsPerDrawCallPerOp._4_4_);
      pTVar9 = tcu::TestLog::operator<<(pTVar9,&local_11c8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1308,"TimePerDrawcallPerOp",&local_1309);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1330,"Estimated cost of one draw call with one shader operation",
                 &local_1331);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1358,"us",&local_1359);
      tcu::LogNumber<float>::LogNumber
                (&local_12e8,&local_1308,&local_1330,&local_1358,QP_KEY_TAG_TIME,
                 (float)usecsPerSingleOp);
      pTVar9 = tcu::TestLog::operator<<(pTVar9,&local_12e8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_13e8,"TimePerSingleOp",&local_13e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1410,"Estimated cost of a single shader operation",&local_1411);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1438,"us",&local_1439);
      tcu::LogNumber<float>::LogNumber
                (&local_13c8,&local_13e8,&local_1410,&local_1438,QP_KEY_TAG_TIME,
                 (float)megaOpsPerSecond);
      tcu::TestLog::operator<<(pTVar9,&local_13c8);
      tcu::LogNumber<float>::~LogNumber(&local_13c8);
      std::__cxx11::string::~string((string *)&local_1438);
      std::allocator<char>::~allocator(&local_1439);
      std::__cxx11::string::~string((string *)&local_1410);
      std::allocator<char>::~allocator(&local_1411);
      std::__cxx11::string::~string((string *)&local_13e8);
      std::allocator<char>::~allocator(&local_13e9);
      tcu::LogNumber<float>::~LogNumber(&local_12e8);
      std::__cxx11::string::~string((string *)&local_1358);
      std::allocator<char>::~allocator(&local_1359);
      std::__cxx11::string::~string((string *)&local_1330);
      std::allocator<char>::~allocator(&local_1331);
      std::__cxx11::string::~string((string *)&local_1308);
      std::allocator<char>::~allocator(&local_1309);
      tcu::LogNumber<float>::~LogNumber(&local_11c8);
      std::__cxx11::string::~string((string *)&local_1278);
      std::allocator<char>::~allocator(&local_1279);
      std::__cxx11::string::~string((string *)&local_1210);
      std::__cxx11::string::~string((string *)&local_1230);
      std::__cxx11::string::~string((string *)&local_1250);
      std::allocator<char>::~allocator(&local_1251);
      std::__cxx11::string::~string((string *)&local_11e8);
      std::allocator<char>::~allocator(&local_11e9);
      tcu::LogNumber<long>::~LogNumber(&local_10a8);
      std::__cxx11::string::~string((string *)&local_1158);
      std::allocator<char>::~allocator(&local_1159);
      std::__cxx11::string::~string((string *)&local_10f0);
      std::__cxx11::string::~string((string *)&local_1110);
      std::__cxx11::string::~string((string *)&local_1130);
      std::allocator<char>::~allocator(&local_1131);
      std::__cxx11::string::~string((string *)&local_10c8);
      std::allocator<char>::~allocator(&local_10c9);
      tcu::LogNumber<long>::~LogNumber(&local_fc0);
      std::__cxx11::string::~string((string *)&local_1030);
      std::allocator<char>::~allocator(&local_1031);
      std::__cxx11::string::~string((string *)&local_1008);
      std::allocator<char>::~allocator(&local_1009);
      std::__cxx11::string::~string((string *)&local_fe0);
      std::allocator<char>::~allocator(&local_fe1);
      tcu::LogNumber<long>::~LogNumber(&local_e98);
      std::__cxx11::string::~string((string *)&local_f48);
      std::allocator<char>::~allocator(&local_f49);
      std::__cxx11::string::~string((string *)&local_ee0);
      std::__cxx11::string::~string((string *)&local_f00);
      std::__cxx11::string::~string((string *)&local_f20);
      std::allocator<char>::~allocator(&local_f21);
      std::__cxx11::string::~string((string *)&local_eb8);
      std::allocator<char>::~allocator(&local_eb9);
      if (local_de0 * -0.1 < usecsPerDrawCallPerOp._4_4_) {
        if (local_de0 * 0.001 < usecsPerDrawCallPerOp._4_4_) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_17c8,"OpsPerSecond",&local_17c9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_17f0,"Operations per second",&local_17f1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1818,"Million/s",&local_1819);
          tcu::LogNumber<float>::LogNumber
                    (&local_17a8,&local_17c8,&local_17f0,&local_1818,QP_KEY_TAG_PERFORMANCE,
                     (float)dStack_e18);
          pTVar4 = tcu::TestLog::operator<<(pTVar4,&local_17a8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_18b0,"NumFreeOps",&local_18b1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_18d8,"Estimated number of \"free\" operations",&local_18d9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_1900,"",&local_1901);
          tcu::LogNumber<long>::LogNumber
                    (&local_1890,&local_18b0,&local_18d8,&local_1900,QP_KEY_TAG_PERFORMANCE,
                     (long)local_e1c);
          tcu::TestLog::operator<<(pTVar4,&local_1890);
          tcu::LogNumber<long>::~LogNumber(&local_1890);
          std::__cxx11::string::~string((string *)&local_1900);
          std::allocator<char>::~allocator(&local_1901);
          std::__cxx11::string::~string((string *)&local_18d8);
          std::allocator<char>::~allocator(&local_18d9);
          std::__cxx11::string::~string((string *)&local_18b0);
          std::allocator<char>::~allocator(&local_18b1);
          tcu::LogNumber<float>::~LogNumber(&local_17a8);
          std::__cxx11::string::~string((string *)&local_1818);
          std::allocator<char>::~allocator(&local_1819);
          std::__cxx11::string::~string((string *)&local_17f0);
          std::allocator<char>::~allocator(&local_17f1);
          std::__cxx11::string::~string((string *)&local_17c8);
          std::allocator<char>::~allocator(&local_17c9);
          this_00 = (this->super_TestCase).super_TestNode.m_testCtx;
          de::floatToString_abi_cxx11_(&local_1928,(de *)0x2,(float)dStack_e18,precision);
          pcVar16 = (char *)std::__cxx11::string::c_str();
          tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,pcVar16);
          std::__cxx11::string::~string((string *)&local_1928);
        }
        else {
          tcu::TestLog::operator<<(&local_1740,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar12 = tcu::MessageBuilder::operator<<
                              (&local_1740,
                               (char (*) [50])"Cost of operation seems to be approximately zero.");
          tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_1740);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
        }
        this->m_state = STATE_FINISHED;
        std::vector<float,_std::allocator<float>_>::~vector
                  ((vector<float,_std::allocator<float>_> *)&maxSlope);
        std::
        vector<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
        ::~vector((vector<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::SegmentedEstimator>_>
                   *)local_50);
        return STOP;
      }
      tcu::TestLog::operator<<(&local_15c0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar12 = tcu::MessageBuilder::operator<<
                          (&local_15c0,(char (*) [30])"Got strongly negative result.");
      tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_15c0);
      pIVar13 = (InternalError *)__cxa_allocate_exception(0x38);
      tcu::InternalError::InternalError
                (pIVar13,"Unable to get sensible measurements for estimation",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pShaderOperatorTests.cpp"
                 ,0x428);
      __cxa_throw(pIVar13,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
    }
    if (this->m_workloadMeasurementNdx < this->m_numMeasurementsPerWorkload) {
      if (this->m_state == STATE_FIND_HIGH_WORKLOAD) {
        local_1948 = std::
                     vector<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
                     ::operator[](&this->m_workloadRecordsFindHigh,(long)this->m_measureProgramNdx);
      }
      else {
        local_1948 = std::
                     vector<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
                     ::operator[](&this->m_workloadRecords,(long)this->m_measureProgramNdx);
      }
      pvVar6 = std::
               vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
               ::back(local_1948);
      iVar2 = deqp::gls::TheilSenCalibrator::getCallCount(&this->m_calibrator);
      dVar3 = renderAndMeasure(this,iVar2);
      local_194c = (float)dVar3;
      WorkloadRecord::addFrameTime(pvVar6,local_194c);
      this->m_workloadMeasurementNdx = this->m_workloadMeasurementNdx + 1;
    }
    else {
      prepareNextRound(this);
    }
  }
  else {
    if (SVar1 == STATE_RECOMPUTE_PARAMS) {
      deqp::gls::TheilSenCalibrator::recomputeParameters(&this->m_calibrator);
    }
    else if (SVar1 == STATE_MEASURE) {
      iVar2 = deqp::gls::TheilSenCalibrator::getCallCount(&this->m_calibrator);
      dVar3 = renderAndMeasure(this,iVar2);
      deqp::gls::TheilSenCalibrator::recordIteration(&this->m_calibrator,dVar3);
    }
    SVar1 = deqp::gls::TheilSenCalibrator::getState(&this->m_calibrator);
    if (SVar1 == STATE_FINISHED) {
      pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
      deqp::gls::logCalibrationInfo(pTVar4,&this->m_calibrator);
      adjustAndLogGridAndViewport(this);
      prepareNextRound(this);
      iVar2 = deqp::gls::TheilSenCalibrator::getCallCount(&this->m_calibrator);
      pIVar5 = de::
               SharedPtr<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::InitialCalibration>
               ::operator->(&this->m_initialCalibrationStorage);
      pIVar5->initialNumCalls = iVar2;
    }
  }
  return CONTINUE;
}

Assistant:

OperatorPerformanceCase::IterateResult OperatorPerformanceCase::iterate (void)
{
	const TheilSenCalibrator::State calibratorState = m_calibrator.getState();

	if (calibratorState != TheilSenCalibrator::STATE_FINISHED)
	{
		if (calibratorState == TheilSenCalibrator::STATE_RECOMPUTE_PARAMS)
			m_calibrator.recomputeParameters();
		else if (calibratorState == TheilSenCalibrator::STATE_MEASURE)
			m_calibrator.recordIteration(renderAndMeasure(m_calibrator.getCallCount()));
		else
			DE_ASSERT(false);

		if (m_calibrator.getState() == TheilSenCalibrator::STATE_FINISHED)
		{
			logCalibrationInfo(m_testCtx.getLog(), m_calibrator);
			adjustAndLogGridAndViewport();
			prepareNextRound();
			m_initialCalibrationStorage->initialNumCalls = m_calibrator.getCallCount();
		}
	}
	else if (m_state == STATE_FIND_HIGH_WORKLOAD || m_state == STATE_MEASURING)
	{
		if (m_workloadMeasurementNdx < m_numMeasurementsPerWorkload)
		{
			vector<WorkloadRecord>& records = m_state == STATE_FIND_HIGH_WORKLOAD ? m_workloadRecordsFindHigh[m_measureProgramNdx] : m_workloadRecords[m_measureProgramNdx];
			records.back().addFrameTime((float)renderAndMeasure(m_calibrator.getCallCount()));
			m_workloadMeasurementNdx++;
		}
		else
			prepareNextRound();
	}
	else
	{
		DE_ASSERT(m_state == STATE_REPORTING);

		TestLog&	log				= m_testCtx.getLog();
		const int	drawCallCount	= m_calibrator.getCallCount();

		{
			// Compute per-program estimators for measurements.
			vector<SegmentedEstimator> estimators;
			for (int progNdx = 0; progNdx < (int)m_programs.size(); progNdx++)
				estimators.push_back(computeSegmentedEstimator(getWorkloadMedianDataPoints(progNdx)));

			// Log measurements and their estimators for all programs.
			for (int progNdx = 0; progNdx < (int)m_programs.size(); progNdx++)
			{
				const SegmentedEstimator&	estimator	= estimators[progNdx];
				const string				progNdxStr	= de::toString(progNdx);
				vector<WorkloadRecord>		records		= m_workloadRecords[progNdx];
				std::sort(records.begin(), records.end());

				{
					const tcu::ScopedLogSection section(log,
														"Program" + progNdxStr + "Measurements",
														"Measurements for program " + progNdxStr);

					// Sample list of individual frame times.

					log << TestLog::SampleList("Program" + progNdxStr + "IndividualFrameTimes", "Individual frame times")
						<< TestLog::SampleInfo << TestLog::ValueInfo("Workload",	"Workload",		"",		QP_SAMPLE_VALUE_TAG_PREDICTOR)
											   << TestLog::ValueInfo("FrameTime",	"Frame time",	"us",	QP_SAMPLE_VALUE_TAG_RESPONSE)
						<< TestLog::EndSampleInfo;

					for (int i = 0; i < (int)records.size(); i++)
						for (int j = 0; j < (int)records[i].frameTimes.size(); j++)
							log << TestLog::Sample << records[i].workloadSize << records[i].frameTimes[j] << TestLog::EndSample;

					log << TestLog::EndSampleList;

					// Sample list of median frame times.

					log << TestLog::SampleList("Program" + progNdxStr + "MedianFrameTimes", "Median frame times")
						<< TestLog::SampleInfo << TestLog::ValueInfo("Workload",		"Workload",				"",		QP_SAMPLE_VALUE_TAG_PREDICTOR)
											   << TestLog::ValueInfo("MedianFrameTime",	"Median frame time",	"us",	QP_SAMPLE_VALUE_TAG_RESPONSE)
						<< TestLog::EndSampleInfo;

					for (int i = 0; i < (int)records.size(); i++)
						log << TestLog::Sample << records[i].workloadSize << records[i].getMedianTime() << TestLog::EndSample;

					log << TestLog::EndSampleList;

					log << TestLog::Float("Program" + progNdxStr + "WorkloadCostEstimate", "Workload cost estimate", "us / workload", QP_KEY_TAG_TIME, estimator.right.coefficient);

					if (estimator.pivotX > -std::numeric_limits<float>::infinity())
						log << TestLog::Message << "Note: the data points with x coordinate greater than or equal to " << estimator.pivotX
												<< " seem to form a rising line, and the rest of data points seem to form a near-horizontal line" << TestLog::EndMessage
							<< TestLog::Message << "Note: the left line is estimated to be " << lineParamsString(estimator.left)
												<< " and the right line " << lineParamsString(estimator.right) << TestLog::EndMessage;
					else
						log << TestLog::Message << "Note: the data seem to form a single line: " << lineParamsString(estimator.right) << TestLog::EndMessage;
				}
			}

			for (int progNdx = 0; progNdx < (int)m_programs.size(); progNdx++)
			{
				if (estimators[progNdx].right.coefficient <= 0.0f)
				{
					log << TestLog::Message << "Slope of measurements for program " << progNdx << " isn't positive. Can't get sensible result." << TestLog::EndMessage;
					MEASUREMENT_FAIL();
				}
			}

			// \note For each estimator, .right.coefficient is the increase in draw time (in microseconds) when
			// incrementing shader workload size by 1, when D draw calls are done, with a vertex/fragment count
			// of R.
			//
			// The measurements of any single program can't tell us the final result (time of single operation),
			// so we use computeSingleOperationTime to compute it from multiple programs' measurements in a
			// subclass-defined manner.
			//
			// After that, microseconds per operation can be calculated as singleOperationTime / (D * R).

			{
				vector<float>	perProgramSlopes;
				for (int i = 0; i < (int)m_programs.size(); i++)
					perProgramSlopes.push_back(estimators[i].right.coefficient);

				logSingleOperationCalculationInfo();

				const float		maxSlope				= *std::max_element(perProgramSlopes.begin(), perProgramSlopes.end());
				const float		usecsPerFramePerOp		= computeSingleOperationTime(perProgramSlopes);
				const int		vertexOrFragmentCount	= m_caseType == CASETYPE_VERTEX ?
															getNumVertices(m_gridSizeX, m_gridSizeY) :
															m_viewportWidth*m_viewportHeight;
				const double	usecsPerDrawCallPerOp	= usecsPerFramePerOp / (double)drawCallCount;
				const double	usecsPerSingleOp		= usecsPerDrawCallPerOp / (double)vertexOrFragmentCount;
				const double	megaOpsPerSecond		= (double)(drawCallCount*vertexOrFragmentCount) / usecsPerFramePerOp;
				const int		numFreeOps				= de::max(0, (int)deFloatFloor(intersectionX(estimators[0].left,
																									 LineParameters(estimators[0].right.offset,
																													usecsPerFramePerOp))));

				log << TestLog::Integer("VertexOrFragmentCount",
										"R = " + string(m_caseType == CASETYPE_VERTEX ? "Vertex" : "Fragment") + " count",
										"", QP_KEY_TAG_NONE, vertexOrFragmentCount)

					<< TestLog::Integer("DrawCallsPerFrame", "D = Draw calls per frame", "", QP_KEY_TAG_NONE, drawCallCount)

					<< TestLog::Integer("VerticesOrFragmentsPerFrame",
										"R*D = " + string(m_caseType == CASETYPE_VERTEX ? "Vertices" : "Fragments") + " per frame",
										"", QP_KEY_TAG_NONE, vertexOrFragmentCount*drawCallCount)

					<< TestLog::Float("TimePerFramePerOp",
									  "Estimated cost of R*D " + string(m_caseType == CASETYPE_VERTEX ? "vertices" : "fragments")
									  + " (i.e. one frame) with one shader operation",
									  "us", QP_KEY_TAG_TIME, (float)usecsPerFramePerOp)

					<< TestLog::Float("TimePerDrawcallPerOp",
									  "Estimated cost of one draw call with one shader operation",
									  "us", QP_KEY_TAG_TIME, (float)usecsPerDrawCallPerOp)

					<< TestLog::Float("TimePerSingleOp",
									  "Estimated cost of a single shader operation",
									  "us", QP_KEY_TAG_TIME, (float)usecsPerSingleOp);

				// \note Sometimes, when the operation is free or very cheap, it can happen that the shader with the operation runs,
				//		 for some reason, a bit faster than the shader without the operation, and thus we get a negative result. The
				//		 following threshold values for accepting a negative or almost-zero result are rather quick and dirty.
				if (usecsPerFramePerOp <= -0.1f*maxSlope)
				{
					log << TestLog::Message << "Got strongly negative result." << TestLog::EndMessage;
					MEASUREMENT_FAIL();
				}
				else if (usecsPerFramePerOp <= 0.001*maxSlope)
				{
					log << TestLog::Message << "Cost of operation seems to be approximately zero." << TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
				}
				else
				{
					log << TestLog::Float("OpsPerSecond",
										  "Operations per second",
										  "Million/s", QP_KEY_TAG_PERFORMANCE, (float)megaOpsPerSecond)

						<< TestLog::Integer("NumFreeOps",
											"Estimated number of \"free\" operations",
											"", QP_KEY_TAG_PERFORMANCE, numFreeOps);

					m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString((float)megaOpsPerSecond, 2).c_str());
				}

				m_state = STATE_FINISHED;
			}
		}

		return STOP;
	}

	return CONTINUE;
}